

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O0

rbtree_node_base * eastl::RBTreeIncrement(rbtree_node_base *pNode)

{
  this_type *local_18;
  rbtree_node_base *pNodeTemp;
  rbtree_node_base *pNode_local;
  
  if (pNode->mpNodeRight == (this_type *)0x0) {
    pNodeTemp = pNode;
    for (local_18 = pNode->mpNodeParent; pNodeTemp == local_18->mpNodeRight;
        local_18 = local_18->mpNodeParent) {
      pNodeTemp = local_18;
    }
    if (pNodeTemp->mpNodeRight != local_18) {
      pNodeTemp = local_18;
    }
  }
  else {
    for (pNodeTemp = pNode->mpNodeRight; pNodeTemp->mpNodeLeft != (this_type *)0x0;
        pNodeTemp = pNodeTemp->mpNodeLeft) {
    }
  }
  return pNodeTemp;
}

Assistant:

EASTL_API rbtree_node_base* RBTreeIncrement(const rbtree_node_base* pNode)
    {
        if(pNode->mpNodeRight) 
        {
            pNode = pNode->mpNodeRight;

            while(pNode->mpNodeLeft)
                pNode = pNode->mpNodeLeft;
        }
        else 
        {
            rbtree_node_base* pNodeTemp = pNode->mpNodeParent;

            while(pNode == pNodeTemp->mpNodeRight) 
            {
                pNode = pNodeTemp;
                pNodeTemp = pNodeTemp->mpNodeParent;
            }

            if(pNode->mpNodeRight != pNodeTemp)
                pNode = pNodeTemp;
        }

        return const_cast<rbtree_node_base*>(pNode);
    }